

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O2

void remove_recolour(opr_rbtree *head,opr_rbtree_node *parent,opr_rbtree_node *node)

{
  opr_rbtree_node *poVar1;
  opr_rbtree_node *poVar2;
  opr_rbtree_node *node_00;
  opr_rbtree_node *node_01;
  
  do {
    node_00 = parent;
    if ((node != (opr_rbtree_node *)0x0) && (node->red != 0)) goto LAB_0010e529;
    if (node == head->root) goto LAB_0010e524;
    node_01 = node_00->left;
    if (node_01 == node) {
      node_01 = node_00->right;
      if (node_01->red != 0) {
        node_01->red = 0;
        node_00->red = 1;
        rotateleft(head,node_00);
        node_01 = node_00->right;
      }
      poVar1 = node_01->left;
      if ((poVar1 == (opr_rbtree_node *)0x0) || (poVar1->red == 0)) {
        poVar2 = node_01->right;
        if ((poVar2 == (opr_rbtree_node *)0x0) || (poVar2->red == 0)) goto LAB_0010e487;
LAB_0010e4e5:
        if (poVar2->red == 0) goto LAB_0010e4eb;
      }
      else {
        poVar2 = node_01->right;
        if (poVar2 != (opr_rbtree_node *)0x0) goto LAB_0010e4e5;
LAB_0010e4eb:
        poVar1->red = 0;
        node_01->red = 1;
        rotateright(head,node_01);
        node_01 = node_00->right;
        poVar2 = node_01->right;
      }
      node_01->red = node_00->red;
      node_00->red = 0;
      poVar2->red = 0;
      rotateleft(head,node_00);
      goto LAB_0010e521;
    }
    if (node_01->red != 0) {
      node_01->red = 0;
      node_00->red = 1;
      rotateright(head,node_00);
      node_01 = node_00->left;
    }
    poVar1 = node_01->left;
    if ((poVar1 != (opr_rbtree_node *)0x0) && (poVar1->red != 0)) goto LAB_0010e4bf;
    poVar2 = node_01->right;
    if ((poVar2 != (opr_rbtree_node *)0x0) && (poVar2->red != 0)) break;
LAB_0010e487:
    node_01->red = 1;
    parent = node_00->parent;
    node = node_00;
  } while( true );
  if (poVar1 != (opr_rbtree_node *)0x0) {
    if (poVar1->red != 0) goto LAB_0010e4bf;
    poVar2 = node_01->right;
  }
  poVar2->red = 0;
  node_01->red = 1;
  rotateleft(head,node_01);
  node_01 = node_00->left;
  poVar1 = node_01->left;
LAB_0010e4bf:
  node_01->red = node_00->red;
  node_00->red = 0;
  poVar1->red = 0;
  rotateright(head,node_00);
LAB_0010e521:
  node = head->root;
LAB_0010e524:
  if (node != (opr_rbtree_node *)0x0) {
LAB_0010e529:
    node->red = 0;
  }
  return;
}

Assistant:

static void remove_recolour(struct opr_rbtree *head,
			    struct opr_rbtree_node *parent,
			    struct opr_rbtree_node *node)
{
	struct opr_rbtree_node *other;

	while ((node == NULL || !node->red) && node != head->root) {
		if (parent->left == node) {
			other = parent->right;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateleft(head, parent);
				other = parent->right;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if ((other->right == NULL) ||
				    (!other->right->red)) {
					other->left->red = 0;
					other->red = 1;
					rotateright(head, other);
					other = parent->right;
				}
				other->red = parent->red;
				parent->red = 0;
				other->right->red = 0;
				rotateleft(head, parent);
				node = head->root;
				break;
			}
		} else {
			other = parent->left;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateright(head, parent);
				other = parent->left;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if (other->left == NULL || !other->left->red) {
					other->right->red = 0;
					other->red = 1;
					rotateleft(head, other);
					other = parent->left;
				}
				other->red = parent->red;
				parent->red = 0;
				other->left->red = 0;
				rotateright(head, parent);
				node = head->root;
				break;
			}
		}
	}
	if (node)
		node->red = 0;
}